

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ssl_ext_pre_shared_key_add_serverhello(SSL_HANDSHAKE *hs,CBB *out)

{
  int iVar1;
  undefined1 local_50 [8];
  CBB contents;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  if ((*(ushort *)&hs->ssl->s3->field_0xdc >> 5 & 1) == 0) {
    hs_local._7_1_ = true;
  }
  else {
    contents.u._24_8_ = out;
    iVar1 = CBB_add_u16(out,0x29);
    if ((((iVar1 != 0) &&
         (iVar1 = CBB_add_u16_length_prefixed((CBB *)contents.u._24_8_,(CBB *)local_50), iVar1 != 0)
         ) && (iVar1 = CBB_add_u16((CBB *)local_50,0), iVar1 != 0)) &&
       (iVar1 = CBB_flush((CBB *)contents.u._24_8_), iVar1 != 0)) {
      return true;
    }
    hs_local._7_1_ = false;
  }
  return hs_local._7_1_;
}

Assistant:

bool ssl_ext_pre_shared_key_add_serverhello(SSL_HANDSHAKE *hs, CBB *out) {
  if (!hs->ssl->s3->session_reused) {
    return true;
  }

  CBB contents;
  if (!CBB_add_u16(out, TLSEXT_TYPE_pre_shared_key) ||  //
      !CBB_add_u16_length_prefixed(out, &contents) ||   //
      // We only consider the first identity for resumption
      !CBB_add_u16(&contents, 0) ||  //
      !CBB_flush(out)) {
    return false;
  }

  return true;
}